

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_transaction_tests.cpp
# Opt level: O3

void __thiscall wallet::wallet_transaction_tests::roundtrip::test_method(roundtrip *this)

{
  bool bVar1;
  int iVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  readonly_property<bool> rVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  lazy_ostream local_178;
  undefined1 *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  int local_134;
  class_property<bool> *local_130;
  assertion_result *local_128;
  int *local_120;
  char *local_118;
  assertion_result local_110;
  undefined **local_f8;
  undefined1 local_f0;
  undefined1 *local_e8;
  class_property<bool> **local_e0;
  class_property<bool> local_d8;
  undefined1 uStack_d7;
  undefined1 uStack_d6;
  undefined1 uStack_d5;
  undefined1 uStack_d4;
  undefined1 uStack_d3;
  undefined1 uStack_d2;
  undefined1 uStack_d1;
  undefined1 uStack_d0;
  undefined1 uStack_cf;
  undefined1 uStack_ce;
  undefined1 uStack_cd;
  undefined1 uStack_cc;
  undefined1 uStack_cb;
  undefined1 uStack_ca;
  undefined1 uStack_c9;
  undefined1 uStack_c8;
  undefined1 uStack_c7;
  undefined1 uStack_c6;
  undefined1 uStack_c5;
  undefined1 uStack_c4;
  undefined1 uStack_c3;
  undefined1 uStack_c2;
  undefined1 uStack_c1;
  undefined8 uStack_c0;
  assertion_result local_b8;
  undefined8 uStack_a0;
  _Variadic_union<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  local_98;
  byte local_70;
  class_property<bool> local_60;
  undefined1 uStack_5f;
  undefined1 uStack_5e;
  undefined1 uStack_5d;
  undefined1 uStack_5c;
  undefined1 uStack_5b;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  undefined1 uStack_58;
  undefined1 uStack_57;
  undefined1 uStack_56;
  undefined1 uStack_55;
  undefined1 uStack_54;
  undefined1 uStack_53;
  undefined1 uStack_52;
  undefined1 uStack_51;
  undefined1 uStack_50;
  undefined1 uStack_4f;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  assertion_result **ppaStack_48;
  int local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  rVar5.super_class_property<bool>.value = (class_property<bool>)false;
  do {
    local_134 = -2;
    do {
      uStack_4f = 0;
      uStack_4e = 0;
      uStack_4d = 0;
      uStack_4c = 0;
      uStack_4b = 0;
      uStack_4a = 0;
      uStack_49 = 0;
      ppaStack_48 = (assertion_result **)0x0;
      uStack_5f = 0;
      uStack_5e = 0;
      uStack_5d = 0;
      uStack_5c = 0;
      uStack_5b = 0;
      uStack_5a = 0;
      uStack_59 = 0;
      uStack_58 = 0;
      uStack_57 = 0;
      uStack_56 = 0;
      uStack_55 = 0;
      uStack_54 = 0;
      uStack_53 = 0;
      uStack_52 = 0;
      uStack_51 = 0;
      uStack_50 = 0;
      auVar9[0] = -(rVar5.super_class_property<bool>.value == (class_property<bool>)'\0');
      auVar9[1] = 0xff;
      auVar9[2] = 0xff;
      auVar9[3] = 0xff;
      auVar9[4] = 0xff;
      auVar9[5] = 0xff;
      auVar9[6] = 0xff;
      auVar9[7] = 0xff;
      auVar9[8] = 0xff;
      auVar9[9] = 0xff;
      auVar9[10] = 0xff;
      auVar9[0xb] = 0xff;
      auVar9[0xc] = 0xff;
      auVar9[0xd] = 0xff;
      auVar9[0xe] = 0xff;
      auVar9[0xf] = 0xff;
      auVar6[8] = 0xff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6[9] = 0xff;
      auVar6[10] = 0xff;
      auVar6[0xb] = 0xff;
      auVar6[0xc] = 0xff;
      auVar6[0xd] = 0xff;
      auVar6[0xe] = 0xff;
      auVar6[0xf] = 0xff;
      auVar6 = auVar6 & auVar9;
      if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 | 0x80 |
                   (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe | 0x8000) == 0xffff) {
        if (local_134 != 0) goto LAB_00816140;
        local_98._0_8_ = (ulong)(uint7)local_98._1_7_ << 8;
LAB_00816133:
        local_70 = 3;
      }
      else {
        auVar10[0] = -(rVar5.super_class_property<bool>.value == (class_property<bool>)'\x01');
        auVar10[1] = 0xff;
        auVar10[2] = 0xff;
        auVar10[3] = 0xff;
        auVar10[4] = 0xff;
        auVar10[5] = 0xff;
        auVar10[6] = 0xff;
        auVar10[7] = 0xff;
        auVar10[8] = 0xff;
        auVar10[9] = 0xff;
        auVar10[10] = 0xff;
        auVar10[0xb] = 0xff;
        auVar10[0xc] = 0xff;
        auVar10[0xd] = 0xff;
        auVar10[0xe] = 0xff;
        auVar10[0xf] = 0xff;
        auVar7[8] = 0xff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7[9] = 0xff;
        auVar7[10] = 0xff;
        auVar7[0xb] = 0xff;
        auVar7[0xc] = 0xff;
        auVar7[0xd] = 0xff;
        auVar7[0xe] = 0xff;
        auVar7[0xf] = 0xff;
        auVar7 = auVar7 & auVar10;
        if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 | 0x80 |
                     (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe | 0x8000) == 0xffff) {
          if (local_134 == -1) {
            local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
            [0] = 1;
            goto LAB_00816133;
          }
LAB_00816140:
          local_98._0_8_ = ZEXT18((byte)rVar5.super_class_property<bool>.value);
          local_98._8_8_ = 0;
          local_98._16_8_ = 0;
          local_98._24_8_ = 0;
          local_70 = 4;
          local_98._M_first._M_storage.confirmed_block_height = local_134;
        }
        else if (local_134 < 0) {
          if (local_134 != -1) goto LAB_00816140;
          local_98._0_8_ = ZEXT18((byte)rVar5.super_class_property<bool>.value);
          local_98._8_8_ = 0;
          local_98._16_8_ = 0;
          local_98._24_8_ = 0;
          local_98._M_first._M_storage.confirmed_block_height = -1;
          local_70 = 2;
        }
        else {
          local_98._0_8_ = ZEXT18((byte)rVar5.super_class_property<bool>.value);
          local_98._8_8_ = 0;
          local_98._16_8_ = 0;
          local_98._24_8_ = 0;
          local_98._M_first._M_storage.confirmed_block_height = -1;
          local_70 = 0;
          local_98._M_first._M_storage.position_in_block = local_134;
        }
      }
      local_148 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_transaction_tests.cpp"
      ;
      local_140 = "";
      local_158 = &boost::unit_test::basic_cstring<char_const>::null;
      local_150 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x13;
      file.m_begin = (iterator)&local_148;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      local_60 = rVar5.super_class_property<bool>.value;
      local_40 = local_134;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_158,msg)
      ;
      local_178.m_empty = false;
      local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
      local_168 = boost::unit_test::lazy_ostream::inst;
      local_160 = "";
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__deduce_visit_result<uint256>,_util::Overloaded<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:102:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:103:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:104:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:105:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:106:9)>_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
        ::_S_vtable._M_arr[local_70]._M_data)
                ((uint256 *)&local_b8,
                 (Overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:102:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:103:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:104:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:105:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:106:9)>
                  *)&local_60,
                 (variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  *)&local_98._M_first);
      uStack_c7 = 0;
      uStack_c6 = 0;
      uStack_c5 = 0;
      uStack_c4 = 0;
      uStack_c3 = 0;
      uStack_c2 = 0;
      uStack_c1 = 0;
      uStack_c0 = 0;
      uStack_d7 = 0;
      uStack_d6 = 0;
      uStack_d5 = 0;
      uStack_d4 = 0;
      uStack_d3 = 0;
      uStack_d2 = 0;
      uStack_d1 = 0;
      uStack_d0 = 0;
      uStack_cf = 0;
      uStack_ce = 0;
      uStack_cd = 0;
      uStack_cc = 0;
      uStack_cb = 0;
      uStack_ca = 0;
      uStack_c9 = 0;
      uStack_c8 = 0;
      auVar8[0] = -(local_b8.p_predicate_value.super_readonly_property<bool>.
                    super_class_property<bool>.value ==
                   (readonly_property<bool>)rVar5.super_class_property<bool>.value);
      auVar8[1] = -(local_b8._1_1_ == '\0');
      auVar8[2] = -(local_b8._2_1_ == '\0');
      auVar8[3] = -(local_b8._3_1_ == '\0');
      auVar8[4] = -(local_b8._4_1_ == '\0');
      auVar8[5] = -(local_b8._5_1_ == '\0');
      auVar8[6] = -(local_b8._6_1_ == '\0');
      auVar8[7] = -(local_b8._7_1_ == '\0');
      auVar8[8] = -((char)local_b8.m_message.px == '\0');
      auVar8[9] = -(local_b8.m_message.px._1_1_ == '\0');
      auVar8[10] = -(local_b8.m_message.px._2_1_ == '\0');
      auVar8[0xb] = -(local_b8.m_message.px._3_1_ == '\0');
      auVar8[0xc] = -(local_b8.m_message.px._4_1_ == '\0');
      auVar8[0xd] = -(local_b8.m_message.px._5_1_ == '\0');
      auVar8[0xe] = -(local_b8.m_message.px._6_1_ == '\0');
      auVar8[0xf] = -(local_b8.m_message.px._7_1_ == '\0');
      auVar11[0] = -((char)local_b8.m_message.pn.pi_ == '\0');
      auVar11[1] = -((char)((ulong)local_b8.m_message.pn.pi_ >> 8) == '\0');
      auVar11[2] = -((char)((ulong)local_b8.m_message.pn.pi_ >> 0x10) == '\0');
      auVar11[3] = -((char)((ulong)local_b8.m_message.pn.pi_ >> 0x18) == '\0');
      auVar11[4] = -((char)((ulong)local_b8.m_message.pn.pi_ >> 0x20) == '\0');
      auVar11[5] = -((char)((ulong)local_b8.m_message.pn.pi_ >> 0x28) == '\0');
      auVar11[6] = -((char)((ulong)local_b8.m_message.pn.pi_ >> 0x30) == '\0');
      auVar11[7] = -((char)((ulong)local_b8.m_message.pn.pi_ >> 0x38) == '\0');
      auVar11[8] = -((char)uStack_a0 == '\0');
      auVar11[9] = -((char)((ulong)uStack_a0 >> 8) == '\0');
      auVar11[10] = -((char)((ulong)uStack_a0 >> 0x10) == '\0');
      auVar11[0xb] = -((char)((ulong)uStack_a0 >> 0x18) == '\0');
      auVar11[0xc] = -((char)((ulong)uStack_a0 >> 0x20) == '\0');
      auVar11[0xd] = -((char)((ulong)uStack_a0 >> 0x28) == '\0');
      auVar11[0xe] = -((char)((ulong)uStack_a0 >> 0x30) == '\0');
      auVar11[0xf] = -((char)((ulong)uStack_a0 >> 0x38) == '\0');
      auVar11 = auVar11 & auVar8;
      local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           (readonly_property<bool>)
           ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff);
      local_110.m_message.px = (element_type *)0x0;
      local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_120 = (int *)0xf8f141;
      local_118 = "";
      uStack_58 = 0;
      local_60.value = true;
      uStack_5f = 0xed;
      uStack_5e = 0x3a;
      uStack_5d = 1;
      uStack_5c = 0;
      uStack_5b = 0;
      uStack_5a = 0;
      uStack_59 = 0;
      uStack_50 = 0x38;
      uStack_4f = 0x21;
      uStack_4e = 0x3c;
      uStack_4d = 1;
      uStack_4c = 0;
      uStack_4b = 0;
      uStack_4a = 0;
      uStack_49 = 0;
      ppaStack_48 = &local_128;
      local_130 = &local_d8;
      local_f0 = 0;
      local_f8 = &PTR__lazy_ostream_013aed38;
      local_e8 = boost::unit_test::lazy_ostream::inst;
      local_e0 = &local_130;
      pvVar3 = (iterator)0x1;
      pvVar4 = (iterator)0x2;
      local_128 = &local_b8;
      local_d8 = rVar5.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                (&local_110,&local_178,1,2,REQUIRE,0x110e730,(size_t)&local_120,0x13,
                 (Overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:102:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:103:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:104:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:105:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:106:9)>
                  *)&local_60,"uint256{hash}",&local_f8);
      boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
      local_188 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_transaction_tests.cpp"
      ;
      local_180 = "";
      local_198 = &boost::unit_test::basic_cstring<char_const>::null;
      local_190 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x14;
      file_00.m_begin = (iterator)&local_188;
      msg_00.m_end = pvVar4;
      msg_00.m_begin = pvVar3;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_198,
                 msg_00);
      local_178.m_empty = false;
      local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
      local_168 = boost::unit_test::lazy_ostream::inst;
      local_160 = "";
      iVar2 = (*std::__detail::__variant::
                __gen_vtable<std::__detail::__variant::__deduce_visit_result<int>,_util::Overloaded<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:114:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:115:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:116:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:117:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:118:9)>_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
                ::_S_vtable._M_arr[local_70]._M_data)
                        ((Overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:114:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:115:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:116:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:117:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:118:9)>
                          *)&local_60,
                         (variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                          *)&local_98._M_first);
      local_128 = (assertion_result *)CONCAT44(local_128._4_4_,iVar2);
      local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar2 == local_134);
      local_b8.m_message.px._0_1_ = '\0';
      local_b8.m_message.px._1_1_ = '\0';
      local_b8.m_message.px._2_1_ = '\0';
      local_b8.m_message.px._3_1_ = '\0';
      local_b8.m_message.px._4_1_ = '\0';
      local_b8.m_message.px._5_1_ = '\0';
      local_b8.m_message.px._6_1_ = '\0';
      local_b8.m_message.px._7_1_ = '\0';
      local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_d8.value = true;
      uStack_d7 = 0xf1;
      uStack_d6 = 0xf8;
      uStack_d5 = 0;
      uStack_d4 = 0;
      uStack_d3 = 0;
      uStack_d2 = 0;
      uStack_d1 = 0;
      uStack_d0 = 0xb2;
      uStack_cf = 0xf1;
      uStack_ce = 0xf8;
      uStack_cd = 0;
      uStack_cc = 0;
      uStack_cb = 0;
      uStack_ca = 0;
      uStack_c9 = 0;
      local_110._0_8_ = &local_128;
      uStack_58 = 0;
      local_60.value = true;
      uStack_5f = 0xe2;
      uStack_5e = 0x3a;
      uStack_5d = 1;
      uStack_5c = 0;
      uStack_5b = 0;
      uStack_5a = 0;
      uStack_59 = 0;
      uStack_50 = 0x38;
      uStack_4f = 0x21;
      uStack_4e = 0x3c;
      uStack_4d = 1;
      uStack_4c = 0;
      uStack_4b = 0;
      uStack_4a = 0;
      uStack_49 = 0;
      ppaStack_48 = (assertion_result **)&local_110;
      local_120 = &local_134;
      local_f0 = 0;
      local_f8 = &PTR__lazy_ostream_013ae248;
      local_e8 = boost::unit_test::lazy_ostream::inst;
      local_e0 = (class_property<bool> **)&local_120;
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_b8,&local_178,1,2,REQUIRE,0x110e677,(size_t)&local_d8,0x14,
                 (Overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:102:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:103:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:104:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:105:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:106:9)>
                  *)&local_60,"index",&local_f8);
      boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
      iVar2 = local_134 + 1;
      bVar1 = local_134 < 2;
      local_134 = iVar2;
    } while (bVar1);
    rVar5.super_class_property<bool>.value =
         (class_property<bool>)((char)rVar5.super_class_property<bool>.value + 1);
    if (rVar5.super_class_property<bool>.value == true) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(roundtrip)
{
    for (uint8_t hash = 0; hash < 5; ++hash) {
        for (int index = -2; index < 3; ++index) {
            TxState state = TxStateInterpretSerialized(TxStateUnrecognized{uint256{hash}, index});
            BOOST_CHECK_EQUAL(TxStateSerializedBlockHash(state), uint256{hash});
            BOOST_CHECK_EQUAL(TxStateSerializedIndex(state), index);
        }
    }
}